

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

SocketAddress *
kj::anon_unknown_0::SocketAddress::getLocalAddress(SocketAddress *__return_storage_ptr__,int sockfd)

{
  int osErrorNumber;
  void *pvVar1;
  SocketAddress *result;
  Fault local_28;
  Fault f;
  SyscallResult local_10;
  undefined1 local_c [4];
  SyscallResult _kjSyscallResult;
  int sockfd_local;
  
  local_c = (undefined1  [4])sockfd;
  SocketAddress(__return_storage_ptr__);
  __return_storage_ptr__->addrlen = 0x80;
  f.exception = (Exception *)local_c;
  local_10 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::SocketAddress::getLocalAddress(int)::_lambda()_1_>
                       ((anon_class_16_2_b2512774 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_10);
  if (pvVar1 != (void *)0x0) {
    return __return_storage_ptr__;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_10);
  kj::_::Debug::Fault::Fault
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x490,osErrorNumber,"getsockname(sockfd, &result.addr.generic, &result.addrlen)","");
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

static SocketAddress getLocalAddress(int sockfd) {
    SocketAddress result;
    result.addrlen = sizeof(addr);
    KJ_SYSCALL(getsockname(sockfd, &result.addr.generic, &result.addrlen));
    return result;
  }